

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httphandler.cpp
# Opt level: O3

void __thiscall HttpHandler::sendHeader(HttpHandler *this)

{
  ostream *poVar1;
  
  poVar1 = this->response;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Content-Type: ",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->content_type->_M_dataplus)._M_p,
                      this->content_type->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "Cache-Control: no-cache, no-store, must-revalidate\r\nPragma: no-cache\r\nExpires: 0\r\nAccess-Control-Allow-Origin: *\r\n"
             ,0x72);
  if (this->encoding == Gzip) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->response,"Content-Encoding: gzip\r\n",0x18);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->response,"\r\n",2);
  return;
}

Assistant:

void HttpHandler::sendHeader()
{
    this->response << "Content-Type: " << *this->content_type << "\r\n"
                   << "Cache-Control: no-cache, no-store, must-revalidate\r\n"
                      "Pragma: no-cache\r\n"
                      "Expires: 0\r\n"
                      "Access-Control-Allow-Origin: *\r\n";

#if BROTLI_SUPPORT == 1
    if (this->encoding == Encoding::Brotli)
    {
        this->response << "Content-Encoding: br\r\n";
    }
    else
#endif
    if (this->encoding == Encoding::Gzip)
    {
        this->response << "Content-Encoding: gzip\r\n";
    }

    this->response << "\r\n";
}